

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void __thiscall ImGuiTextFilter::Build(ImGuiTextFilter *this)

{
  char *pcVar1;
  ImGuiTextRange *pIVar2;
  size_t sVar3;
  long lVar4;
  ImGuiTextRange *pIVar5;
  char *pcVar6;
  char *pcVar7;
  int iVar8;
  ImGuiTextRange input_range;
  ImGuiTextRange local_30;
  
  if ((this->Filters).Capacity < 0) {
    pIVar2 = (ImGuiTextRange *)ImGui::MemAlloc(0);
    pIVar5 = (this->Filters).Data;
    if (pIVar5 != (ImGuiTextRange *)0x0) {
      memcpy(pIVar2,pIVar5,(long)(this->Filters).Size << 4);
      ImGui::MemFree((this->Filters).Data);
    }
    (this->Filters).Data = pIVar2;
    (this->Filters).Capacity = 0;
  }
  iVar8 = 0;
  (this->Filters).Size = 0;
  sVar3 = strlen(this->InputBuf);
  local_30.e = this->InputBuf + sVar3;
  local_30.b = this->InputBuf;
  ImGuiTextRange::split(&local_30,',',&this->Filters);
  this->CountGrep = 0;
  lVar4 = (long)(this->Filters).Size;
  if (lVar4 == 0) {
    return;
  }
  pIVar5 = (this->Filters).Data;
  pIVar2 = pIVar5 + lVar4;
LAB_00177183:
  pcVar6 = pIVar5->b;
  pcVar1 = pIVar5->e;
  pcVar7 = pcVar6;
  if (pcVar6 < pcVar1) {
    do {
      if ((*pcVar6 != ' ') && (pcVar7 = pcVar6, *pcVar6 != '\t')) break;
      pcVar6 = pcVar6 + 1;
      pIVar5->b = pcVar6;
      pcVar7 = pcVar1;
    } while (pcVar6 != pcVar1);
  }
  do {
    if (pcVar1 <= pcVar7) break;
    pcVar6 = pcVar1 + -1;
    if ((*pcVar6 != ' ') && (*pcVar6 != '\t')) break;
    pIVar5->e = pcVar6;
    pcVar1 = pcVar6;
  } while( true );
  if ((pcVar7 != pcVar1) && (*pcVar7 != '-')) {
    iVar8 = iVar8 + 1;
    this->CountGrep = iVar8;
  }
  pIVar5 = pIVar5 + 1;
  if (pIVar5 == pIVar2) {
    return;
  }
  goto LAB_00177183;
}

Assistant:

void ImGuiTextFilter::Build()
{
    Filters.resize(0);
    ImGuiTextRange input_range(InputBuf, InputBuf + strlen(InputBuf));
    input_range.split(',', &Filters);

    CountGrep = 0;
    for (ImGuiTextRange& f : Filters)
    {
        while (f.b < f.e && ImCharIsBlankA(f.b[0]))
            f.b++;
        while (f.e > f.b && ImCharIsBlankA(f.e[-1]))
            f.e--;
        if (f.empty())
            continue;
        if (f.b[0] != '-')
            CountGrep += 1;
    }
}